

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::VariableDatum::Encode(VariableDatum *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *this_00;
  pointer pDVar2;
  ushort local_2a;
  const_iterator cStack_28;
  KUINT16 i;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  VariableDatum *this_local;
  
  this_00 = KDataStream::operator<<(stream,this->m_ui32DatumID);
  KDataStream::operator<<(this_00,this->m_ui32DatumLength);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
            ::begin(&this->m_v8DatumValue);
  cStack_28 = std::
              vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
              ::end(&this->m_v8DatumValue);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&stack0xffffffffffffffd8);
    if (!bVar1) break;
    for (local_2a = 0; local_2a < 8; local_2a = local_2a + 1) {
      pDVar2 = __gnu_cxx::
               __normal_iterator<const_KDIS::DATA_TYPE::VariableDatum::DatumEntry_*,_std::vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>_>
               ::operator->(&citrEnd);
      KDataStream::operator<<(stream,pDVar2->Buffer[local_2a]);
    }
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::VariableDatum::DatumEntry_*,_std::vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void VariableDatum::Encode( KDataStream & stream ) const
{
    stream << m_ui32DatumID
           << m_ui32DatumLength;

    vector<DatumEntry>::const_iterator citr = m_v8DatumValue.begin();
    vector<DatumEntry>::const_iterator citrEnd = m_v8DatumValue.end();

    while( citr != citrEnd )
    {
        for( KUINT16 i = 0; i < 8; ++i )
        {
            stream << citr->Buffer[i];
        }

        ++citr;
    }
}